

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase2CS::Run(BasicStdLayoutBase2CS *this)

{
  CallLogWrapper *pCVar1;
  bool bVar2;
  int iVar3;
  GLuint program;
  undefined4 extraout_var;
  size_t sVar4;
  void *pvVar5;
  long lVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  GLint blocksCS;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [4];
  stringstream ss;
  allocator_type local_24d;
  int local_24c;
  CallLogWrapper *local_248;
  string local_240;
  GLuint *local_220;
  long local_218 [12];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  char *__s;
  
  local_218[10] = 0;
  local_218[0xb] = 0;
  local_218[8] = 0;
  local_218[9] = 0;
  local_218[6] = 0;
  local_218[7] = 0;
  local_218[4] = 0;
  local_218[5] = 0;
  local_218[2] = 0;
  local_218[3] = 0;
  local_218[0] = 0;
  local_218[1] = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pCVar1 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0x90db,&local_24c);
  if (local_24c < 8) {
    lVar8 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(local_size_x = 1) in;\n",0x1d);
    iVar3 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this,local_218);
    __s = (char *)CONCAT44(extraout_var,iVar3);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
    }
    std::__cxx11::stringbuf::str();
    program = ShaderStorageBufferObjectBase::CreateProgramCS
                        (&this->super_ShaderStorageBufferObjectBase,&local_240);
    this->m_program = program;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      program = this->m_program;
    }
    glu::CallLogWrapper::glLinkProgram(pCVar1,program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar8 = -1;
    if (bVar2) {
      local_220 = this->m_buffer;
      glu::CallLogWrapper::glGenBuffers(pCVar1,8,local_220);
      plVar10 = local_218 + 1;
      lVar8 = 0;
      do {
        glu::CallLogWrapper::glBindBufferBase(pCVar1,0x90d2,(GLuint)lVar8,this->m_buffer[lVar8]);
        glu::CallLogWrapper::glBufferData
                  (pCVar1,0x90d2,*plVar10 - plVar10[-1],(void *)plVar10[-1],0x88e4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_240,
                   *plVar10 - plVar10[-1],&local_24d);
        glu::CallLogWrapper::glBindBufferBase
                  (pCVar1,0x90d2,(GLuint)lVar8 + 4,this->m_buffer[lVar8 + 4]);
        glu::CallLogWrapper::glBufferData
                  (pCVar1,0x90d2,*plVar10 - plVar10[-1],local_240._M_dataplus._M_p,0x88e4);
        if (local_240._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_240._M_dataplus._M_p,
                          local_240.field_2._M_allocated_capacity - (long)local_240._M_dataplus._M_p
                         );
        }
        plVar10 = plVar10 + 3;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
      glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x200);
      bVar7 = 1;
      uVar11 = 0;
      bVar2 = false;
      local_248 = pCVar1;
      do {
        pCVar1 = local_248;
        glu::CallLogWrapper::glBindBuffer(local_248,0x90d2,local_220[uVar11 + 4]);
        pvVar5 = glu::CallLogWrapper::glMapBufferRange
                           (pCVar1,0x90d2,0,local_218[uVar11 * 3 + 1] - local_218[uVar11 * 3],1);
        if (pvVar5 == (void *)0x0) break;
        lVar8 = local_218[uVar11 * 3];
        lVar6 = local_218[uVar11 * 3 + 1];
        if (lVar6 != lVar8) {
          uVar9 = 0;
          do {
            if (*(char *)(lVar8 + uVar9) != *(char *)((long)pvVar5 + uVar9)) {
              anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar9 & 0xffffffff)
              ;
              lVar8 = local_218[uVar11 * 3];
              lVar6 = local_218[uVar11 * 3 + 1];
              bVar7 = 0;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < (ulong)(lVar6 - lVar8));
        }
        glu::CallLogWrapper::glUnmapBuffer(local_248,0x90d2);
        bVar2 = 2 < uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 4);
      lVar8 = -1;
      if (bVar2) {
        lVar8 = -(ulong)(~bVar7 & 1);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  lVar6 = 0x60;
  do {
    pvVar5 = *(void **)((long)&local_240.field_2 + lVar6);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)((long)&local_220 + lVar6) - (long)pvVar5);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  return lVar8;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data[4];
		std::stringstream	ss;
		GLint				 blocksCS;
		glGetIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &blocksCS);
		if (blocksCS < 8)
			return NO_ERROR;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data);
		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_buffer);

		for (GLuint i = 0; i < 4; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &in_data[i][0], GL_STATIC_DRAW);

			std::vector<GLubyte> out_data(in_data[i].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_buffer[i + 4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool status = true;
		for (int j = 0; j < 4; ++j)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 4]);
			GLubyte* out_data =
				(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), GL_MAP_READ_BIT);
			if (!out_data)
				return ERROR;

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}